

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O0

void poly1305_blocks(poly1305_state_internal *st,uint8_t *m,size_t bytes)

{
  poly1305_power *ppVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  xmmi C2;
  xmmi C1;
  xmmi M4;
  xmmi M3;
  xmmi M2;
  xmmi M1;
  xmmi M0;
  xmmi T6;
  xmmi T5;
  xmmi T4;
  xmmi T3;
  xmmi T2;
  xmmi T1;
  xmmi T0;
  xmmi H4;
  xmmi H3;
  xmmi H2;
  xmmi H1;
  xmmi H0;
  poly1305_power *p;
  xmmi HIBIT;
  xmmi FIVE;
  xmmi MMASK;
  size_t bytes_local;
  uint8_t *m_local;
  poly1305_state_internal *st_local;
  
  H1[1] = (st->field_1).H[0][0];
  H0[0] = (st->field_1).H[0][1];
  H2[1] = (st->field_1).H[1][0];
  H1[0] = (st->field_1).H[1][1];
  H3[1] = (st->field_1).H[2][0];
  H2[0] = (st->field_1).H[2][1];
  H4[1] = (st->field_1).H[3][0];
  H3[0] = (st->field_1).H[3][1];
  T0[1] = (st->field_1).H[4][0];
  H4[0] = (st->field_1).H[4][1];
  bytes_local = (size_t)m;
  for (MMASK[1] = bytes; 0x3f < (ulong)MMASK[1]; MMASK[1] = MMASK[1] + -0x40) {
    uVar11 = *(ulong *)bytes_local;
    uVar12 = *(ulong *)(bytes_local + 0x10);
    uVar22 = *(ulong *)(bytes_local + 0x18);
    uVar23 = uVar11 & 0x3ffffff;
    uVar13 = uVar12 & 0x3ffffff;
    uVar2 = uVar11 >> 0x1a & 0x3ffffff;
    uVar14 = uVar12 >> 0x1a & 0x3ffffff;
    uVar3 = *(ulong *)(bytes_local + 8) << 0xc;
    uVar4 = uVar11 >> 0x34 | uVar3 & 0x3ffffff;
    uVar15 = uVar12 >> 0x34 | uVar22 & 0x3ffffff;
    uVar3 = uVar3 >> 0x1a & 0x3ffffff;
    uVar16 = uVar22 >> 0x1a & 0x3ffffff;
    uVar5 = *(ulong *)(bytes_local + 8) >> 0x28 | 0x1000000;
    uVar17 = uVar22 >> 0x28 | 0x1000000;
    ppVar1 = st->P + 1;
    uVar11 = *(ulong *)(bytes_local + 0x20);
    uVar12 = *(ulong *)(bytes_local + 0x30);
    uVar22 = *(ulong *)(bytes_local + 0x38);
    uVar6 = *(ulong *)(bytes_local + 0x28) << 0xc;
    uVar7 = (H1[1] & 0xffffffffU) * (st->P[0].R20.u[0] & 0xffffffff) +
            (H2[1] & 0xffffffffU) * (st->P[0].S24.u[0] & 0xffffffff) +
            (H3[1] & 0xffffffffU) * (st->P[0].S23.u[0] & 0xffffffff) +
            (H4[1] & 0xffffffffU) * (st->P[0].S22.u[0] & 0xffffffff) +
            (T0[1] & 0xffffffffU) * (st->P[0].S21.u[0] & 0xffffffff) +
            uVar23 * ((ppVar1->R20).u[0] & 0xffffffff) + uVar2 * (st->P[1].S24.u[0] & 0xffffffff) +
            uVar4 * (st->P[1].S23.u[0] & 0xffffffff) + uVar3 * (st->P[1].S22.u[0] & 0xffffffff) +
            uVar5 * (st->P[1].S21.u[0] & 0xffffffff) + (uVar11 & 0x3ffffff);
    uVar18 = (H0[0] & 0xffffffffU) * (st->P[0].R20.u[1] & 0xffffffff) +
             (H1[0] & 0xffffffffU) * (st->P[0].S24.u[1] & 0xffffffff) +
             (H2[0] & 0xffffffffU) * (st->P[0].S23.u[1] & 0xffffffff) +
             (H3[0] & 0xffffffffU) * (st->P[0].S22.u[1] & 0xffffffff) +
             (H4[0] & 0xffffffffU) * (st->P[0].S21.u[1] & 0xffffffff) +
             uVar13 * (st->P[1].R20.u[1] & 0xffffffff) + uVar14 * (st->P[1].S24.u[1] & 0xffffffff) +
             uVar15 * (st->P[1].S23.u[1] & 0xffffffff) + uVar16 * (st->P[1].S22.u[1] & 0xffffffff) +
             uVar17 * (st->P[1].S21.u[1] & 0xffffffff) + (uVar12 & 0x3ffffff);
    uVar8 = (H1[1] & 0xffffffffU) * (st->P[0].R23.u[0] & 0xffffffff) +
            (H2[1] & 0xffffffffU) * (st->P[0].R22.u[0] & 0xffffffff) +
            (H3[1] & 0xffffffffU) * (st->P[0].R21.u[0] & 0xffffffff) +
            (H4[1] & 0xffffffffU) * (st->P[0].R20.u[0] & 0xffffffff) +
            (T0[1] & 0xffffffffU) * (st->P[0].S24.u[0] & 0xffffffff) +
            uVar23 * (st->P[1].R23.u[0] & 0xffffffff) + uVar2 * (st->P[1].R22.u[0] & 0xffffffff) +
            uVar4 * (st->P[1].R21.u[0] & 0xffffffff) + uVar3 * ((ppVar1->R20).u[0] & 0xffffffff) +
            uVar5 * (st->P[1].S24.u[0] & 0xffffffff) + (uVar6 >> 0x1a & 0x3ffffff);
    uVar19 = (H0[0] & 0xffffffffU) * (st->P[0].R23.u[1] & 0xffffffff) +
             (H1[0] & 0xffffffffU) * (st->P[0].R22.u[1] & 0xffffffff) +
             (H2[0] & 0xffffffffU) * (st->P[0].R21.u[1] & 0xffffffff) +
             (H3[0] & 0xffffffffU) * (st->P[0].R20.u[1] & 0xffffffff) +
             (H4[0] & 0xffffffffU) * (st->P[0].S24.u[1] & 0xffffffff) +
             uVar13 * (st->P[1].R23.u[1] & 0xffffffff) + uVar14 * (st->P[1].R22.u[1] & 0xffffffff) +
             uVar15 * (st->P[1].R21.u[1] & 0xffffffff) + uVar16 * (st->P[1].R20.u[1] & 0xffffffff) +
             uVar17 * (st->P[1].S24.u[1] & 0xffffffff) + (uVar22 >> 0x1a & 0x3ffffff);
    uVar9 = (H1[1] & 0xffffffffU) * (st->P[0].R21.u[0] & 0xffffffff) +
            (H2[1] & 0xffffffffU) * (st->P[0].R20.u[0] & 0xffffffff) +
            (H3[1] & 0xffffffffU) * (st->P[0].S24.u[0] & 0xffffffff) +
            (H4[1] & 0xffffffffU) * (st->P[0].S23.u[0] & 0xffffffff) +
            (T0[1] & 0xffffffffU) * (st->P[0].S22.u[0] & 0xffffffff) +
            uVar23 * (st->P[1].R21.u[0] & 0xffffffff) + uVar2 * ((ppVar1->R20).u[0] & 0xffffffff) +
            uVar4 * (st->P[1].S24.u[0] & 0xffffffff) + uVar3 * (st->P[1].S23.u[0] & 0xffffffff) +
            uVar5 * (st->P[1].S22.u[0] & 0xffffffff) + (uVar11 >> 0x1a & 0x3ffffff) +
            (uVar7 >> 0x1a);
    uVar20 = (H0[0] & 0xffffffffU) * (st->P[0].R21.u[1] & 0xffffffff) +
             (H1[0] & 0xffffffffU) * (st->P[0].R20.u[1] & 0xffffffff) +
             (H2[0] & 0xffffffffU) * (st->P[0].S24.u[1] & 0xffffffff) +
             (H3[0] & 0xffffffffU) * (st->P[0].S23.u[1] & 0xffffffff) +
             (H4[0] & 0xffffffffU) * (st->P[0].S22.u[1] & 0xffffffff) +
             uVar13 * (st->P[1].R21.u[1] & 0xffffffff) + uVar14 * (st->P[1].R20.u[1] & 0xffffffff) +
             uVar15 * (st->P[1].S24.u[1] & 0xffffffff) + uVar16 * (st->P[1].S23.u[1] & 0xffffffff) +
             uVar17 * (st->P[1].S22.u[1] & 0xffffffff) + (uVar12 >> 0x1a & 0x3ffffff) +
             (uVar18 >> 0x1a);
    uVar10 = (H1[1] & 0xffffffffU) * (st->P[0].R24.u[0] & 0xffffffff) +
             (H2[1] & 0xffffffffU) * (st->P[0].R23.u[0] & 0xffffffff) +
             (H3[1] & 0xffffffffU) * (st->P[0].R22.u[0] & 0xffffffff) +
             (H4[1] & 0xffffffffU) * (st->P[0].R21.u[0] & 0xffffffff) +
             (T0[1] & 0xffffffffU) * (st->P[0].R20.u[0] & 0xffffffff) +
             uVar23 * (st->P[1].R24.u[0] & 0xffffffff) + uVar2 * (st->P[1].R23.u[0] & 0xffffffff) +
             uVar4 * (st->P[1].R22.u[0] & 0xffffffff) + uVar3 * (st->P[1].R21.u[0] & 0xffffffff) +
             uVar5 * ((ppVar1->R20).u[0] & 0xffffffff) +
             (*(ulong *)(bytes_local + 0x28) >> 0x28 | 0x1000000) + (uVar8 >> 0x1a);
    uVar21 = (H0[0] & 0xffffffffU) * (st->P[0].R24.u[1] & 0xffffffff) +
             (H1[0] & 0xffffffffU) * (st->P[0].R23.u[1] & 0xffffffff) +
             (H2[0] & 0xffffffffU) * (st->P[0].R22.u[1] & 0xffffffff) +
             (H3[0] & 0xffffffffU) * (st->P[0].R21.u[1] & 0xffffffff) +
             (H4[0] & 0xffffffffU) * (st->P[0].R20.u[1] & 0xffffffff) +
             uVar13 * (st->P[1].R24.u[1] & 0xffffffff) + uVar14 * (st->P[1].R23.u[1] & 0xffffffff) +
             uVar15 * (st->P[1].R22.u[1] & 0xffffffff) + uVar16 * (st->P[1].R21.u[1] & 0xffffffff) +
             uVar17 * (st->P[1].R20.u[1] & 0xffffffff) + (uVar22 >> 0x28 | 0x1000000) +
             (uVar19 >> 0x1a);
    uVar11 = (H1[1] & 0xffffffffU) * (st->P[0].R22.u[0] & 0xffffffff) +
             (H2[1] & 0xffffffffU) * (st->P[0].R21.u[0] & 0xffffffff) +
             (H3[1] & 0xffffffffU) * (st->P[0].R20.u[0] & 0xffffffff) +
             (H4[1] & 0xffffffffU) * (st->P[0].S24.u[0] & 0xffffffff) +
             (T0[1] & 0xffffffffU) * (st->P[0].S23.u[0] & 0xffffffff) +
             uVar23 * (st->P[1].R22.u[0] & 0xffffffff) + uVar2 * (st->P[1].R21.u[0] & 0xffffffff) +
             uVar4 * ((ppVar1->R20).u[0] & 0xffffffff) + uVar3 * (st->P[1].S24.u[0] & 0xffffffff) +
             uVar5 * (st->P[1].S23.u[0] & 0xffffffff) + (uVar11 >> 0x34 | uVar6 & 0x3ffffff) +
             (uVar9 >> 0x1a);
    uVar22 = (H0[0] & 0xffffffffU) * (st->P[0].R22.u[1] & 0xffffffff) +
             (H1[0] & 0xffffffffU) * (st->P[0].R21.u[1] & 0xffffffff) +
             (H2[0] & 0xffffffffU) * (st->P[0].R20.u[1] & 0xffffffff) +
             (H3[0] & 0xffffffffU) * (st->P[0].S24.u[1] & 0xffffffff) +
             (H4[0] & 0xffffffffU) * (st->P[0].S23.u[1] & 0xffffffff) +
             uVar13 * (st->P[1].R22.u[1] & 0xffffffff) + uVar14 * (st->P[1].R21.u[1] & 0xffffffff) +
             uVar15 * (st->P[1].R20.u[1] & 0xffffffff) + uVar16 * (st->P[1].S24.u[1] & 0xffffffff) +
             uVar17 * (st->P[1].S23.u[1] & 0xffffffff) + (uVar12 >> 0x34 | uVar22 & 0x3ffffff) +
             (uVar20 >> 0x1a);
    uVar12 = (uVar7 & 0x3ffffff) + (uVar10 >> 0x1a & 0xffffffff) * 5;
    uVar23 = (uVar18 & 0x3ffffff) + (uVar21 >> 0x1a & 0xffffffff) * 5;
    H3[1] = uVar11 & 0x3ffffff;
    H2[0] = uVar22 & 0x3ffffff;
    H1[1] = uVar12 & 0x3ffffff;
    H0[0] = uVar23 & 0x3ffffff;
    uVar11 = (uVar8 & 0x3ffffff) + (uVar11 >> 0x1a);
    uVar22 = (uVar19 & 0x3ffffff) + (uVar22 >> 0x1a);
    H2[1] = (uVar9 & 0x3ffffff) + (uVar12 >> 0x1a);
    H1[0] = (uVar20 & 0x3ffffff) + (uVar23 >> 0x1a);
    H4[1] = uVar11 & 0x3ffffff;
    H3[0] = uVar22 & 0x3ffffff;
    T0[1] = (uVar10 & 0x3ffffff) + (uVar11 >> 0x1a);
    H4[0] = (uVar21 & 0x3ffffff) + (uVar22 >> 0x1a);
    bytes_local = bytes_local + 0x40;
  }
  (st->field_1).H[0][0] = H1[1];
  (st->field_1).H[0][1] = H0[0];
  (st->field_1).H[1][0] = H2[1];
  (st->field_1).H[1][1] = H1[0];
  (st->field_1).H[2][0] = H3[1];
  (st->field_1).H[2][1] = H2[0];
  (st->field_1).H[3][0] = H4[1];
  (st->field_1).H[3][1] = H3[0];
  (st->field_1).H[4][0] = T0[1];
  (st->field_1).H[4][1] = H4[0];
  return;
}

Assistant:

static void poly1305_blocks(poly1305_state_internal *st, const uint8_t *m,
                            size_t bytes) {
  const xmmi MMASK =
      _mm_load_si128((const xmmi *)poly1305_x64_sse2_message_mask);
  const xmmi FIVE = _mm_load_si128((const xmmi *)poly1305_x64_sse2_5);
  const xmmi HIBIT = _mm_load_si128((const xmmi *)poly1305_x64_sse2_1shl128);

  poly1305_power *p;
  xmmi H0, H1, H2, H3, H4;
  xmmi T0, T1, T2, T3, T4, T5, T6;
  xmmi M0, M1, M2, M3, M4;
  xmmi C1, C2;

  H0 = st->H[0];
  H1 = st->H[1];
  H2 = st->H[2];
  H3 = st->H[3];
  H4 = st->H[4];

  while (bytes >= 64) {
    // H *= [r^4,r^4]
    p = &st->P[0];
    T0 = _mm_mul_epu32(H0, p->R20.v);
    T1 = _mm_mul_epu32(H0, p->R21.v);
    T2 = _mm_mul_epu32(H0, p->R22.v);
    T3 = _mm_mul_epu32(H0, p->R23.v);
    T4 = _mm_mul_epu32(H0, p->R24.v);
    T5 = _mm_mul_epu32(H1, p->S24.v);
    T6 = _mm_mul_epu32(H1, p->R20.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H2, p->S23.v);
    T6 = _mm_mul_epu32(H2, p->S24.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H3, p->S22.v);
    T6 = _mm_mul_epu32(H3, p->S23.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H4, p->S21.v);
    T6 = _mm_mul_epu32(H4, p->S22.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(H1, p->R21.v);
    T6 = _mm_mul_epu32(H1, p->R22.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H2, p->R20.v);
    T6 = _mm_mul_epu32(H2, p->R21.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H3, p->S24.v);
    T6 = _mm_mul_epu32(H3, p->R20.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H4, p->S23.v);
    T6 = _mm_mul_epu32(H4, p->S24.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(H1, p->R23.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(H2, p->R22.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(H3, p->R21.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(H4, p->R20.v);
    T4 = _mm_add_epi64(T4, T5);

    // H += [Mx,My]*[r^2,r^2]
    T5 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 0)),
                            _mm_loadl_epi64((const xmmi *)(m + 16)));
    T6 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 8)),
                            _mm_loadl_epi64((const xmmi *)(m + 24)));
    M0 = _mm_and_si128(MMASK, T5);
    M1 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    T5 = _mm_or_si128(_mm_srli_epi64(T5, 52), _mm_slli_epi64(T6, 12));
    M2 = _mm_and_si128(MMASK, T5);
    M3 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    M4 = _mm_or_si128(_mm_srli_epi64(T6, 40), HIBIT);

    p = &st->P[1];
    T5 = _mm_mul_epu32(M0, p->R20.v);
    T6 = _mm_mul_epu32(M0, p->R21.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M1, p->S24.v);
    T6 = _mm_mul_epu32(M1, p->R20.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M2, p->S23.v);
    T6 = _mm_mul_epu32(M2, p->S24.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M3, p->S22.v);
    T6 = _mm_mul_epu32(M3, p->S23.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M4, p->S21.v);
    T6 = _mm_mul_epu32(M4, p->S22.v);
    T0 = _mm_add_epi64(T0, T5);
    T1 = _mm_add_epi64(T1, T6);
    T5 = _mm_mul_epu32(M0, p->R22.v);
    T6 = _mm_mul_epu32(M0, p->R23.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M1, p->R21.v);
    T6 = _mm_mul_epu32(M1, p->R22.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M2, p->R20.v);
    T6 = _mm_mul_epu32(M2, p->R21.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M3, p->S24.v);
    T6 = _mm_mul_epu32(M3, p->R20.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M4, p->S23.v);
    T6 = _mm_mul_epu32(M4, p->S24.v);
    T2 = _mm_add_epi64(T2, T5);
    T3 = _mm_add_epi64(T3, T6);
    T5 = _mm_mul_epu32(M0, p->R24.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(M1, p->R23.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(M2, p->R22.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(M3, p->R21.v);
    T4 = _mm_add_epi64(T4, T5);
    T5 = _mm_mul_epu32(M4, p->R20.v);
    T4 = _mm_add_epi64(T4, T5);

    // H += [Mx,My]
    T5 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 32)),
                            _mm_loadl_epi64((const xmmi *)(m + 48)));
    T6 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 40)),
                            _mm_loadl_epi64((const xmmi *)(m + 56)));
    M0 = _mm_and_si128(MMASK, T5);
    M1 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    T5 = _mm_or_si128(_mm_srli_epi64(T5, 52), _mm_slli_epi64(T6, 12));
    M2 = _mm_and_si128(MMASK, T5);
    M3 = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
    M4 = _mm_or_si128(_mm_srli_epi64(T6, 40), HIBIT);

    T0 = _mm_add_epi64(T0, M0);
    T1 = _mm_add_epi64(T1, M1);
    T2 = _mm_add_epi64(T2, M2);
    T3 = _mm_add_epi64(T3, M3);
    T4 = _mm_add_epi64(T4, M4);

    // reduce
    C1 = _mm_srli_epi64(T0, 26);
    C2 = _mm_srli_epi64(T3, 26);
    T0 = _mm_and_si128(T0, MMASK);
    T3 = _mm_and_si128(T3, MMASK);
    T1 = _mm_add_epi64(T1, C1);
    T4 = _mm_add_epi64(T4, C2);
    C1 = _mm_srli_epi64(T1, 26);
    C2 = _mm_srli_epi64(T4, 26);
    T1 = _mm_and_si128(T1, MMASK);
    T4 = _mm_and_si128(T4, MMASK);
    T2 = _mm_add_epi64(T2, C1);
    T0 = _mm_add_epi64(T0, _mm_mul_epu32(C2, FIVE));
    C1 = _mm_srli_epi64(T2, 26);
    C2 = _mm_srli_epi64(T0, 26);
    T2 = _mm_and_si128(T2, MMASK);
    T0 = _mm_and_si128(T0, MMASK);
    T3 = _mm_add_epi64(T3, C1);
    T1 = _mm_add_epi64(T1, C2);
    C1 = _mm_srli_epi64(T3, 26);
    T3 = _mm_and_si128(T3, MMASK);
    T4 = _mm_add_epi64(T4, C1);

    // H = (H*[r^4,r^4] + [Mx,My]*[r^2,r^2] + [Mx,My])
    H0 = T0;
    H1 = T1;
    H2 = T2;
    H3 = T3;
    H4 = T4;

    m += 64;
    bytes -= 64;
  }

  st->H[0] = H0;
  st->H[1] = H1;
  st->H[2] = H2;
  st->H[3] = H3;
  st->H[4] = H4;
}